

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  uint *z;
  ulong uVar11;
  undefined1 local_58;
  uint local_57;
  undefined1 local_53;
  char local_52;
  char local_51;
  undefined1 local_50;
  char local_4f;
  char local_4e;
  undefined1 local_4d;
  char local_4c;
  char local_4b;
  undefined1 local_4a;
  char local_49;
  char local_48;
  undefined1 local_47;
  char local_46;
  char local_45;
  undefined1 local_44;
  DateTime x;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  z = (uint *)&local_58;
  iVar10 = isDate(context,argc,argv,&x);
  if (iVar10 == 0) {
    computeYMD_HMS(&x);
    uVar9 = -x.Y;
    if (0 < x.Y) {
      uVar9 = x.Y;
    }
    uVar11 = (ulong)uVar9;
    uVar1 = (uVar11 / 10) % 10;
    uVar2 = ((ulong)uVar9 / 100) % 10;
    uVar3 = (uVar11 / 1000) % 10;
    uVar8 = (ushort)uVar3;
    bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar3 - (0xff < uVar8);
    uVar8 = (ushort)uVar2;
    bVar5 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar2 - (0xff < uVar8);
    uVar8 = (ushort)uVar1;
    bVar6 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar1 - (0xff < uVar8);
    uVar8 = (ushort)(uVar11 % 10);
    bVar7 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar11 % 10) - (0xff < uVar8);
    local_57 = CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                        CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                 CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                          (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4))))
               | (uint)DAT_001e0e40;
    local_53 = 0x2d;
    local_52 = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                            (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    local_51 = (char)(x.M % 10) + '0';
    local_50 = 0x2d;
    local_4f = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                            (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    local_4e = (char)(x.D % 10) + '0';
    local_4d = 0x20;
    local_4c = (char)((long)((ulong)(uint)((int)((long)x.h / 10) >> 0x1f) << 0x20 |
                            (long)x.h / 10 & 0xffffffffU) % 10) + '0';
    local_4b = (char)(x.h % 10) + '0';
    local_4a = 0x3a;
    local_49 = (char)((long)((ulong)(uint)((int)((long)x.m / 10) >> 0x1f) << 0x20 |
                            (long)x.m / 10 & 0xffffffffU) % 10) + '0';
    local_48 = (char)(x.m % 10) + '0';
    local_47 = 0x3a;
    uVar1 = (long)(int)x.s / 10;
    local_46 = (char)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 10) +
               '0';
    local_45 = (char)((int)x.s % 10) + '0';
    local_44 = 0;
    if (x.Y < 0) {
      local_58 = 0x2d;
      iVar10 = 0x14;
    }
    else {
      z = &local_57;
      iVar10 = 0x13;
    }
    sqlite3_result_text(context,(char *)z,iVar10,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s;
    char zBuf[24];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    s = (int)x.s;
    zBuf[18] = '0' + (s/10)%10;
    zBuf[19] = '0' + (s)%10;
    zBuf[20] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 20, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 19, SQLITE_TRANSIENT);
    }
  }
}